

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cpp
# Opt level: O3

Type __thiscall camp::Function::argType(Function *this,size_t index)

{
  pointer pTVar1;
  OutOfRange *__return_storage_ptr__;
  string local_b0;
  string local_90;
  OutOfRange local_70;
  
  pTVar1 = (this->m_argTypes).super__Vector_base<camp::Type,_std::allocator<camp::Type>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (index < (ulong)((long)(this->m_argTypes).
                            super__Vector_base<camp::Type,_std::allocator<camp::Type>_>._M_impl.
                            super__Vector_impl_data._M_finish - (long)pTVar1 >> 2)) {
    return pTVar1[index];
  }
  __return_storage_ptr__ = (OutOfRange *)__cxa_allocate_exception(0x48);
  OutOfRange::OutOfRange
            (&local_70,index,
             (long)(this->m_argTypes).super__Vector_base<camp::Type,_std::allocator<camp::Type>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(this->m_argTypes).super__Vector_base<camp::Type,_std::allocator<camp::Type>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 2);
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b0,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/fw4spl-org[P]camp/src/function.cpp"
             ,"");
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_90,"Type camp::Function::argType(std::size_t) const","");
  Error::prepare<camp::OutOfRange>(__return_storage_ptr__,&local_70,&local_b0,0x42,&local_90);
  __cxa_throw(__return_storage_ptr__,&OutOfRange::typeinfo,Error::~Error);
}

Assistant:

Type Function::argType(std::size_t index) const
{
    // Make sure that the index is not out of range
    if (index >= m_argTypes.size())
        CAMP_ERROR(OutOfRange(index, m_argTypes.size()));

    return m_argTypes[index];
}